

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_list_column.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_true>_>_>
::Intrusive_list_column
          (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_true>_>_>
           *this,Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_true>_>_>
                 *column)

{
  Index IVar1;
  Dimension DVar2;
  Field_operators *pFVar3;
  Entry_constructor *pEVar4;
  
  IVar1 = (column->super_Row_access_option).columnIndex_;
  (column->super_Row_access_option).columnIndex_ = 0;
  (this->super_Row_access_option).columnIndex_ = IVar1;
  (this->super_Row_access_option).rows_ = (column->super_Row_access_option).rows_;
  DVar2 = (column->super_Column_dimension_option).dim_;
  (column->super_Column_dimension_option).dim_ = -1;
  (this->super_Column_dimension_option).dim_ = DVar2;
  pFVar3 = column->operators_;
  column->operators_ = (Field_operators *)0x0;
  this->operators_ = pFVar3;
  pEVar4 = column->entryPool_;
  column->entryPool_ = (Entry_constructor *)0x0;
  this->entryPool_ = pEVar4;
  boost::intrusive::
  list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_true>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)1,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_true>_>::Matrix_column_tag,_1U>,_unsigned_long,_false,_void>
  ::list_impl(&(this->column_).super_type,&(column->column_).super_type);
  return;
}

Assistant:

inline Intrusive_list_column<Master_matrix>::Intrusive_list_column(Intrusive_list_column&& column) noexcept
    : RA_opt(std::move(static_cast<RA_opt&>(column))),
      Dim_opt(std::move(static_cast<Dim_opt&>(column))),
      Chain_opt(std::move(static_cast<Chain_opt&>(column))),
      operators_(std::exchange(column.operators_, nullptr)),
      entryPool_(std::exchange(column.entryPool_, nullptr)),
      column_(std::move(column.column_))
{}